

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__high_bit(uint z)

{
  undefined4 local_14;
  undefined4 local_10;
  int n;
  uint z_local;
  
  local_14 = 0;
  if (z == 0) {
    n = -1;
  }
  else {
    local_10 = z;
    if (0xffff < z) {
      local_14 = 0x10;
      local_10 = z >> 0x10;
    }
    if (0xff < local_10) {
      local_14 = local_14 + 8;
      local_10 = local_10 >> 8;
    }
    if (0xf < local_10) {
      local_14 = local_14 + 4;
      local_10 = local_10 >> 4;
    }
    if (3 < local_10) {
      local_14 = local_14 + 2;
      local_10 = local_10 >> 2;
    }
    if (1 < local_10) {
      local_14 = local_14 + 1;
    }
    n = local_14;
  }
  return n;
}

Assistant:

static int stbi__high_bit(unsigned int z)
{
   int n=0;
   if (z == 0) return -1;
   if (z >= 0x10000) { n += 16; z >>= 16; }
   if (z >= 0x00100) { n +=  8; z >>=  8; }
   if (z >= 0x00010) { n +=  4; z >>=  4; }
   if (z >= 0x00004) { n +=  2; z >>=  2; }
   if (z >= 0x00002) { n +=  1;/* >>=  1;*/ }
   return n;
}